

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O0

void __thiscall wasm::CodeFolding::visitSwitch(CodeFolding *this,Switch *curr)

{
  bool bVar1;
  Name *pNVar2;
  undefined1 local_50 [8];
  Name target;
  Iterator __end2;
  Iterator __begin2;
  ArenaVector<wasm::Name> *__range2;
  Switch *curr_local;
  CodeFolding *this_local;
  
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::begin
                 (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::end
                 (&(curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator!=
                      ((Iterator *)&__end2.index,(Iterator *)&target.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar2 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator*
                       ((Iterator *)&__end2.index);
    local_50 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    target.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
              (&this->unoptimizables,(value_type *)local_50);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::insert
            (&this->unoptimizables,&curr->default_);
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
    for (auto target : curr->targets) {
      unoptimizables.insert(target);
    }
    unoptimizables.insert(curr->default_);
  }